

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void display_img(Mat *disp)

{
  int iVar1;
  allocator<char> local_69;
  _InputArray local_68;
  string local_50 [32];
  
  do {
    std::__cxx11::string::string<std::allocator<char>>(local_50,"Current image",&local_69);
    local_68.sz.width = 0;
    local_68.sz.height = 0;
    local_68.flags = 0x1010000;
    local_68.obj = disp;
    cv::imshow(local_50,&local_68);
    std::__cxx11::string::~string(local_50);
    iVar1 = cv::waitKey(0x1e);
  } while (iVar1 != 0x1b);
  return;
}

Assistant:

void display_img(cv::Mat disp) {
    do {
        cv::imshow("Current image", disp);
        if (cv::waitKey(30) == 27) {
            return;
        }
    } while (true);
}